

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ClassEscapePass0
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,Char *singleton,
          bool *previousSurrogatePart)

{
  EncodedChar **p;
  byte *pbVar1;
  EncodedChar *pEVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  OLECHAR OVar9;
  Char CVar10;
  int iVar11;
  undefined4 *puVar12;
  CharCount n;
  uint uVar13;
  CharCount digits;
  uint uVar14;
  uint uVar15;
  
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar4) goto LAB_00ef012f;
    *puVar12 = 0;
  }
  pbVar1 = this->next;
  if (((ulong)*pbVar1 == 0) && (this->inputLim <= pbVar1)) {
    Fail(this,-0x7ff5ec67);
    return false;
  }
  p = &this->next;
  if ((ASCIIChars::classes[*pbVar1] & 0x20) != 0) {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar14 = 0;
    uVar13 = 0;
    do {
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00ef012f;
        *puVar12 = 0;
      }
      uVar15 = (uint)(byte)ASCIIChars::values[**p] + uVar13 * 8;
      if (uVar15 < 0x100) {
        if (this->inputLim < *p + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar4) goto LAB_00ef012f;
          *puVar12 = 0;
        }
        if ((char)**p < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar4) goto LAB_00ef012f;
          *puVar12 = 0;
        }
        *p = *p + 1;
        uVar14 = uVar14 + 1;
        uVar13 = uVar15;
      }
      if ((0xff < uVar15) || (2 < uVar14)) break;
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00ef012f;
        *puVar12 = 0;
      }
    } while ((ASCIIChars::classes[**p] & 0x20) != 0);
    *singleton = (Char)uVar13;
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    goto LAB_00eefd0e;
  }
  pEVar2 = this->tempLocationOfSurrogatePair;
  this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
  if (this->inputLim <= pbVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar4) goto LAB_00ef012f;
    *puVar12 = 0;
  }
  OVar9 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                    (&this->super_UTF8EncodingPolicyBase<false>,p,this->inputLim);
  if ((ushort)OVar9 < 0x100) {
    bVar4 = (bool)((ASCIIChars::classes[(ushort)OVar9] & 2) >> 1);
  }
  else {
    bVar4 = (OVar9 & 0xfffeU) == 0x2028;
  }
  if (bVar4 != false) {
    Fail(this,-0x7ff5fc0c);
  }
  bVar4 = false;
  if (0x61 < (ushort)OVar9) {
    switch(OVar9) {
    case L'b':
      *singleton = L'\b';
      break;
    case L'c':
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00ef012f;
        *puVar12 = 0;
      }
      if ((ASCIIChars::classes[**p] & 8) == 0) {
        DeferredFailIfUnicode(this,-0x7ff5e9d6);
      }
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) {
LAB_00ef012f:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar12 = 0;
      }
      if ((ASCIIChars::classes[**p] & 1) == 0) {
        ECRevert(this,1);
        *singleton = L'\\';
      }
      else {
        bVar5 = ECLookahead(this,0);
        CVar10 = Chars<char16_t>::UTC((uint)(bVar5 & 0x1f));
        *singleton = CVar10;
        n = 1;
LAB_00ef0072:
        ECConsume(this,n);
      }
      break;
    case L'd':
    case L's':
    case L'w':
      goto switchD_00eefd6d_caseD_64;
    case L'f':
      *singleton = L'\f';
      break;
    case L'n':
      *singleton = L'\n';
      break;
    case L'r':
      *singleton = L'\r';
      break;
    case L't':
      *singleton = L'\t';
      break;
    case L'u':
      this->tempLocationOfSurrogatePair = pEVar2;
      iVar11 = TryParseExtendedUnicodeEscape(this,singleton,previousSurrogatePart,true);
      if (0 < iVar11) {
        return true;
      }
      if (((this->next + 4 <= this->inputLim) &&
          (bVar5 = ECLookahead(this,0), (ASCIIChars::classes[bVar5] & 0x40) != 0)) &&
         ((bVar5 = ECLookahead(this,1), (ASCIIChars::classes[bVar5] & 0x40) != 0 &&
          ((bVar5 = ECLookahead(this,2), (ASCIIChars::classes[bVar5] & 0x40) != 0 &&
           (bVar5 = ECLookahead(this,3), (ASCIIChars::classes[bVar5] & 0x40) != 0)))))) {
        bVar5 = ECLookahead(this,0);
        bVar5 = ASCIIChars::values[bVar5];
        bVar6 = ECLookahead(this,1);
        bVar6 = ASCIIChars::values[bVar6];
        bVar7 = ECLookahead(this,2);
        bVar7 = ASCIIChars::values[bVar7];
        bVar8 = ECLookahead(this,3);
        CVar10 = Chars<char16_t>::UTC
                           ((uint)(byte)ASCIIChars::values[bVar8] | (uint)bVar7 << 4 |
                            (uint)bVar6 << 8 | (uint)bVar5 << 0xc);
        *singleton = CVar10;
        if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
          TrackIfSurrogatePair(this,(uint)(ushort)CVar10,this->next + -1,5);
        }
        ECConsume(this,4);
        return true;
      }
      *singleton = OVar9;
      return true;
    case L'v':
      *singleton = L'\v';
      break;
    case L'x':
      if (((this->next + 2 <= this->inputLim) &&
          (bVar5 = ECLookahead(this,0), (ASCIIChars::classes[bVar5] & 0x40) != 0)) &&
         (bVar5 = ECLookahead(this,1), (ASCIIChars::classes[bVar5] & 0x40) != 0)) {
        bVar5 = ECLookahead(this,0);
        bVar5 = ASCIIChars::values[bVar5];
        bVar6 = ECLookahead(this,1);
        CVar10 = Chars<char16_t>::UTC((uint)(byte)ASCIIChars::values[bVar6] | (uint)bVar5 << 4);
        *singleton = CVar10;
        n = 2;
        goto LAB_00ef0072;
      }
    default:
switchD_00eefd6d_caseD_65:
      *singleton = OVar9;
    }
LAB_00eefd0e:
    bVar4 = true;
switchD_00eefd6d_caseD_64:
    return bVar4;
  }
  if (OVar9 == L'D') {
    return false;
  }
  if (OVar9 == L'S') {
    return false;
  }
  if (OVar9 == L'W') {
    return false;
  }
  goto switchD_00eefd6d_caseD_65;
}

Assistant:

bool Parser<P, IsLiteral>::ClassEscapePass0(Char& singleton, bool& previousSurrogatePart)
    {
        // Could be terminating 0
        EncodedChar ec = ECLookahead();
        if (ec == 0 && IsEOF())
        {
            Fail(JSERR_RegExpSyntax);
            return false;
        }
        else if (standardEncodedChars->IsOctal(ec))
        {
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) //Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not octal
            singleton = UTC((UChar)n);
            // Clear possible pair
            this->tempLocationOfSurrogatePair = nullptr;
            return true;
        }
        else
        {
            const EncodedChar* location = this->tempLocationOfSurrogatePair;
            // Clear it for now, otherwise to many branches to clear it on.
            this->tempLocationOfSurrogatePair = nullptr;
            // An escaped '/' is ok
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                singleton = '\b';
                return true;
            case 'f':
                singleton = '\f';
                return true;
            case 'n':
                singleton = '\n';
                return true;
            case 'r':
                singleton = '\r';
                return true;
            case 't':
                singleton = '\t';
                return true;
            case 'v':
                singleton = '\v';
                return true;
            case 'd':
            case 'D':
            case 's':
            case 'S':
            case 'w':
            case 'W':
                return false;
            case 'c':
                if (!standardEncodedChars->IsLetter(ECLookahead())) //Letter set [A-Z, a-z]
                {
                    // Fail in unicode mode for non-letter escaped control characters according to 262 Annex-B RegExp grammar spec #prod-annexB-Term 
                    DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                }

                if (standardEncodedChars->IsWord(ECLookahead())) // word set [A-Z,a-z,0-9,_], terminating 0 is not a word character
                {
                    singleton = UTC(Chars<EncodedChar>::CTU(ECLookahead()) % 32);
                    ECConsume();
                }
                else
                {
                    // If the lookahead is a non-alphanumeric and not an underscore ('_'), then treat '\' and 'c' separately.
                    //#sec-regular-expression-patterns-semantics 
                    ECRevert(1); //Put cursor back at 'c' and treat it as a non-escaped character.
                    singleton = '\\';
                }
                return true;
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                }
                else
                    singleton = c;
                return true;
            case 'u':
                this->tempLocationOfSurrogatePair = location;
                if (this->TryParseExtendedUnicodeEscape(singleton, previousSurrogatePart, true) > 0)
                    return true;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                    {
                        // Current location
                        TrackIfSurrogatePair(singleton, (next - 1), 5);
                    }
                    // The above if statement, if true, will clear tempLocationOfSurrogatePair if needs to.
                    ECConsume(4);
                }
                else
                    singleton = c;
                return true;
            default:
                // embedded 0 is ok
                singleton = c;
                return true;
            }
        }
    }